

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCase::
verify<tcu::Texture2DView,tcu::Vector<float,2>>
          (TextureGatherCase *this,ConstPixelBufferAccess *rendered,Texture2DView *texture,
          Vector<float,_2> (*texCoords) [4],GatherArgs *gatherArgs)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  TextureFormat TVar4;
  long lVar5;
  TextureFormat TVar6;
  PixelOffsets *pPVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  Vector<float,_2> *pVVar11;
  int iVar12;
  string *psVar13;
  ConstPixelBufferAccess *pCVar14;
  Surface *pSVar15;
  Vector<float,_2> *pVVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int px;
  float fVar17;
  int px_2;
  int iVar18;
  float fVar19;
  ChannelOrder CVar20;
  void *data;
  undefined8 uVar21;
  ChannelOrder CVar22;
  int iVar23;
  ChannelOrder CVar24;
  int px_1;
  int iVar25;
  float fVar26;
  float fVar27;
  undefined4 uVar28;
  float fVar31;
  undefined1 auVar29 [16];
  float fVar32;
  undefined1 auVar30 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Vector<bool,_4> res_1;
  ColorVec resultPix_1;
  Surface errorMask_1;
  Surface ideal;
  Surface errorMask;
  Vec4 resultPix;
  TextureLevel ideal_1;
  Vec4 idealPix;
  PixelBufferAccess idealAccess;
  Vec4 refColor;
  IVec2 offsets [4];
  IVec4 colorBits;
  undefined1 local_4b8 [8];
  TextureFormat TStack_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  float local_48c;
  TextureFormat local_488;
  float local_47c;
  undefined1 local_478 [8];
  TextureFormat local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  Vector<float,_2> (*local_458) [4];
  ConstPixelBufferAccess *local_450;
  undefined1 local_448 [8];
  TextureFormat TStack_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438 [2];
  undefined8 local_418;
  void *local_410;
  void *local_408;
  string local_400;
  Texture2DView *local_3e0;
  Vector<float,_2> *local_3d8;
  Vector<float,_2> *local_3d0;
  Vector<float,_2> *local_3c8;
  Vector<float,_2> *local_3c0;
  string local_3b8;
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  TextureFormat TStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Alloc_hider local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [6];
  float local_2f8;
  ChannelType CStack_2f4;
  ChannelOrder CStack_2f0;
  ChannelType CStack_2ec;
  TextureLevel local_2e8;
  undefined1 local_2b8 [24];
  undefined2 local_2a0;
  undefined2 uStack_29e;
  undefined1 local_29c;
  undefined1 local_288 [24];
  TextureFormat local_270;
  int aiStack_268 [2];
  BVec4 local_260;
  Vector<float,_2> *local_250;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  local_248;
  Sampler local_238;
  undefined1 local_1f8 [8];
  IVec2 IStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [4];
  ios_base local_180 [264];
  IVec4 local_78 [4];
  
  TVar4 = *(TextureFormat *)(*(long *)(this + 8) + 0x10);
  local_458 = texCoords;
  local_3e0 = texture;
  if (((byte)this[0xb4] & 1) != 0) {
    uVar10 = 0;
    if (0 < gatherArgs->componentNdx) {
      uVar10 = (ulong)(uint)gatherArgs->componentNdx;
    }
    local_388._0_4_ = R;
    local_388._4_4_ = SNORM_INT8;
    TStack_380.order = R;
    TStack_380.type = 0x3f800000;
    local_238.wrapT = *(WrapMode *)(local_388 + uVar10 * 4);
    local_398 = ZEXT416(local_238.wrapT);
    local_238.wrapS = local_238.wrapT;
    local_238.minFilter = local_238.wrapT;
    local_238.wrapR = local_238.wrapT;
    bVar9 = Functional::anon_unknown_0::verifySingleColored
                      ((TestLog *)TVar4,rendered,(Vec4 *)&local_238);
    if (bVar9) {
      return bVar9;
    }
    local_1f8 = (undefined1  [8])TVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&IStack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&IStack_1f0,"Note: expected color ",0x15);
    tcu::operator<<((ostream *)&IStack_1f0,(Vector<float,_4> *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&IStack_1f0," for all pixels; ",0x11);
    std::ostream::_M_insert<double>((double)(float)local_398._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&IStack_1f0," is component at index ",0x17);
    std::ostream::operator<<((ostringstream *)&IStack_1f0,(int)uVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&IStack_1f0," in the color ",0xe);
    tcu::operator<<((ostream *)&IStack_1f0,(Vector<float,_4> *)local_388);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&IStack_1f0,", which is used for incomplete textures",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&IStack_1f0);
    std::ios_base::~ios_base(local_180);
    return bVar9;
  }
  uVar35 = *(uint *)(this + 0x78);
  local_488 = TVar4;
  local_450 = rendered;
  Functional::anon_unknown_0::TextureGatherCase::getOffsetRange((TextureGatherCase *)local_1f8);
  Functional::anon_unknown_0::makePixelOffsetsFunctor
            (&local_248,(anon_unknown_0 *)(ulong)uVar35,(GatherType)gatherArgs,
             (GatherArgs *)((ulong)local_1f8 & 0xffffffff),(IVec2 *)((ulong)local_1f8 >> 0x20));
  pPVar7 = local_248.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
           .m_data.ptr;
  local_78[0].m_data[0] = 7;
  local_78[0].m_data[1] = 7;
  local_78[0].m_data[2] = 7;
  local_78[0].m_data[3] = 7;
  uVar10 = (ulong)*(uint *)(this + 0xb8);
  CVar22 = ~R;
  iVar23 = -1;
  iVar18 = -1;
  iVar25 = -1;
  if (uVar10 < 3) {
    CVar22 = *(ChannelOrder *)(&DAT_01c7f4a0 + uVar10 * 4);
    iVar23 = *(uint *)(this + 0xb8) * 10;
    iVar18 = *(int *)(&DAT_01c7f4ac + uVar10 * 4);
    iVar25 = *(int *)(&DAT_01c7f4b8 + uVar10 * 4);
  }
  local_238.wrapR = WRAPMODE_LAST;
  local_238.minFilter = FILTERMODE_LAST;
  local_238.magFilter = FILTERMODE_LAST;
  local_238.lodThreshold = 0.0;
  local_238.normalizedCoords = true;
  local_238.depthStencilMode = MODE_DEPTH;
  local_238._32_8_ = 0;
  local_238.borderColor.v._4_5_ = 0;
  local_238.borderColor.v.uData[2]._1_3_ = 0;
  local_238._48_5_ = 0;
  local_238._0_8_ = *(undefined8 *)(this + 0x8c);
  local_238.compare = *(CompareMode *)(this + 0x88);
  if ((*(int *)(this + 0x80) == 0x14) || (*(int *)(this + 0x80) == 0x12)) {
    local_2e8.m_format.type = CVar22;
    local_2e8.m_format.order = CVar22;
    local_2e8.m_size.m_data[1] = iVar18;
    local_2e8.m_size.m_data[0] = iVar23;
    local_2e8.m_data.m_ptr = (void *)0x1000000010;
    local_2e8._20_4_ = iVar25;
    local_2e8.m_size.m_data[2] = iVar18;
    local_2e8.m_data.m_cap._0_4_ = 7;
    local_418 = &PTR_operator___02165428;
    local_410 = (void *)0x4000000040;
    fVar17 = (float)(local_450->m_size).m_data[0];
    tcu::Surface::Surface((Surface *)&local_400,(int)fVar17,(int)fVar17);
    local_1f8._0_4_ = RGBA;
    local_1f8._4_4_ = UNORM_INT8;
    data = (void *)CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                            local_400.field_2._M_allocated_capacity._0_6_);
    if ((void *)CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                         local_400.field_2._M_allocated_capacity._0_6_) != (void *)0x0) {
      data = (void *)local_400._M_string_length;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)local_1f8,
               (int)local_400._M_dataplus._M_p,local_400._M_dataplus._M_p._4_4_,1,data);
    tcu::Surface::Surface((Surface *)&local_3b8,(int)fVar17,(int)fVar17);
    local_388._0_4_ = RGBA;
    local_388._4_4_ = UNORM_INT8;
    uVar21 = local_3b8.field_2._M_allocated_capacity;
    if ((void *)local_3b8.field_2._M_allocated_capacity != (void *)0x0) {
      uVar21 = local_3b8._M_string_length;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1f8,(TextureFormat *)local_388,
               (int)local_3b8._M_dataplus._M_p,local_3b8._M_dataplus._M_p._4_4_,1,(void *)uVar21);
    local_2b8._0_4_ = 0xff00ff00;
    tcu::RGBA::toVec((RGBA *)local_2b8);
    tcu::clear((PixelBufferAccess *)local_1f8,(Vec4 *)local_388);
    if ((int)fVar17 < 1) {
      bVar9 = true;
    }
    else {
      local_2f8 = (float)(int)fVar17;
      local_3c8 = *local_458 + 1;
      local_3d0 = (Vector<float,_2> *)((*local_458)[1].m_data + 1);
      local_3d8 = *local_458 + 2;
      local_250 = (Vector<float,_2> *)((*local_458)[2].m_data + 1);
      bVar9 = true;
      fVar19 = 0.0;
      local_48c = fVar17;
      do {
        local_47c = ((float)(int)fVar19 + 0.5) / local_2f8;
        local_3c0 = (Vector<float,_2> *)CONCAT44(local_3c0._4_4_,1.0 - local_47c);
        fVar17 = 0.0;
        do {
          local_1e8._M_allocated_capacity = 0;
          local_1e8._8_4_ = 0;
          local_1e8._12_4_ = 0;
          local_1f8._0_4_ = R;
          local_1f8._4_4_ = SNORM_INT8;
          IStack_1f0.m_data[0] = 0;
          IStack_1f0.m_data[1] = 0;
          local_388._4_4_ = fVar19;
          local_388._0_4_ = fVar17;
          (**pPVar7->_vptr_PixelOffsets)
                    (pPVar7,(ConstPixelBufferAccess *)local_388,(IVec2 (*) [4])local_1f8);
          fVar26 = ((float)(int)fVar17 + 0.5) / local_2f8;
          if (1.0 <= local_47c + fVar26) {
            uVar21 = *(undefined8 *)(*local_458)[1].m_data;
            uVar3 = *(undefined8 *)(*local_458)[3].m_data;
            fVar31 = (float)((ulong)uVar3 >> 0x20);
            fVar27 = (1.0 - fVar26) * ((float)uVar21 - (float)uVar3) + (float)uVar3;
            fVar31 = (1.0 - fVar26) * ((float)((ulong)uVar21 >> 0x20) - fVar31) + fVar31;
            pVVar11 = local_3d8;
            pVVar16 = local_250;
            fVar26 = local_3c0._0_4_;
          }
          else {
            uVar3 = *(undefined8 *)(*local_458)[0].m_data;
            uVar21 = *(undefined8 *)(*local_458)[2].m_data;
            fVar31 = (float)((ulong)uVar3 >> 0x20);
            fVar27 = fVar26 * ((float)uVar21 - (float)uVar3) + (float)uVar3;
            fVar31 = fVar26 * ((float)((ulong)uVar21 >> 0x20) - fVar31) + fVar31;
            pVVar11 = local_3c8;
            pVVar16 = local_3d0;
            fVar26 = local_47c;
          }
          local_448._0_4_ = fVar26 * (pVVar11->m_data[0] - (float)uVar3) + fVar27;
          local_448._4_4_ = fVar26 * (pVVar16->m_data[0] - (float)((ulong)uVar3 >> 0x20)) + fVar31;
          uVar28 = (*(code *)*local_418)(&local_418,(ConstPixelBufferAccess *)local_388);
          local_398._0_4_ = uVar28;
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_388,(int)local_450,(int)fVar17,(int)fVar19);
          tcu::gatherArray2DOffsetsCompare
                    ((tcu *)local_2b8,local_3e0->m_levels,&local_238,(float)local_398._0_4_,
                     (float)local_448._0_4_,(float)local_448._4_4_,0,(IVec2 (*) [4])local_1f8);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_288,(Vec4 *)local_2b8,(int)fVar17,(int)fVar19,0);
          auVar29._4_4_ = -(uint)((float)local_2b8._4_4_ == (float)local_388._4_4_);
          auVar29._0_4_ = -(uint)((float)local_2b8._0_4_ == (float)local_388._0_4_);
          auVar29._8_4_ = -(uint)((float)local_2b8._8_4_ == (float)TStack_380.order);
          auVar29._12_4_ = -(uint)((float)local_2b8._12_4_ == (float)TStack_380.type);
          auVar29 = packssdw(auVar29,auVar29);
          auVar29 = packsswb(auVar29,auVar29);
          local_4b8._0_4_ = SUB164(auVar29 & _DAT_01b805f0,0);
          if (SUB161(auVar29 & _DAT_01b805f0,0) == '\0') {
LAB_01622037:
            bVar8 = tcu::isGatherOffsetsCompareResultValid
                              (local_3e0,&local_238,(TexComparePrecision *)&local_2e8,
                               (Vec2 *)local_448,(IVec2 (*) [4])local_1f8,(float)local_398._0_4_,
                               (Vec4 *)local_388);
            if (!bVar8) {
              *(undefined4 *)
               (local_3b8._M_string_length +
               (long)((int)local_3b8._M_dataplus._M_p * (int)fVar19 + (int)fVar17) * 4) = 0xff0000ff
              ;
              bVar9 = false;
            }
          }
          else {
            uVar10 = 0xffffffffffffffff;
            do {
              if (uVar10 == 2) goto LAB_01622094;
              uVar1 = uVar10 + 1;
              lVar5 = uVar10 + 2;
              uVar10 = uVar1;
            } while (local_4b8[lVar5] != '\0');
            if (uVar1 < 3) goto LAB_01622037;
          }
LAB_01622094:
          fVar17 = (float)((int)fVar17 + 1);
        } while (fVar17 != local_48c);
        fVar19 = (float)((int)fVar19 + 1);
      } while (fVar19 != local_48c);
    }
    TVar4 = (TextureFormat)((long)local_2b8 + 0x10);
    local_2b8._16_8_ = 0x6552796669726556;
    _local_2a0 = 0x746c7573;
    local_2b8._8_8_ = 0xc;
    local_29c = '\0';
    local_448 = (undefined1  [8])local_438;
    local_1f8._0_4_ = S;
    local_1f8._4_4_ = SNORM_INT8;
    local_2b8._0_8_ = TVar4;
    local_448 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_448,(ulong)local_1f8);
    local_438[0]._M_allocated_capacity = local_1f8;
    *(undefined8 *)local_448 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_448 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_448 + 0xf),"sult",4);
    TStack_440.order = local_1f8._0_4_;
    TStack_440.type = local_1f8._4_4_;
    *(char *)((long)local_448 + (long)local_1f8) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_388,(string *)local_2b8,(string *)local_448);
    TVar6 = local_488;
    tcu::TestLog::startImageSet((TestLog *)local_488,(char *)local_388,local_368._M_p);
    local_4a8._M_allocated_capacity._0_4_ = 0x646e6552;
    local_4a8._M_allocated_capacity._4_4_ = 0x64657265;
    TStack_4b0.order = RGBA;
    TStack_4b0.type = SNORM_INT8;
    local_4a8._8_2_ = (ushort)(byte)local_4a8._M_local_buf[9] << 8;
    local_468._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_468._M_allocated_capacity._6_2_ = 0x6465;
    local_468._M_local_buf[8] = ' ';
    local_468._M_local_buf[9] = 'i';
    local_468._10_4_ = 0x6567616d;
    local_470.order = sRGB;
    local_470.type = SNORM_INT8;
    local_468._M_local_buf[0xe] = '\0';
    pCVar14 = local_450;
    local_4b8 = (undefined1  [8])&local_4a8;
    local_478 = (undefined1  [8])&local_468;
    tcu::LogImage::LogImage
              ((LogImage *)local_1f8,(string *)local_4b8,(string *)local_478,local_450,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1f8,TVar6.order,__buf,(size_t)pCVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_allocated_capacity != local_1c8) {
      operator_delete((void *)local_1d8._M_allocated_capacity,
                      (ulong)(local_1c8[0]._M_allocated_capacity + 1));
    }
    if (local_1f8 != (undefined1  [8])&local_1e8) {
      operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
    }
    if (local_478 != (undefined1  [8])&local_468) {
      operator_delete((void *)local_478,
                      CONCAT26(local_468._M_allocated_capacity._6_2_,
                               local_468._M_allocated_capacity._0_6_) + 1);
    }
    if (local_4b8 != (undefined1  [8])&local_4a8) {
      operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_p != local_358) {
      operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
    }
    if (local_388 != (undefined1  [8])&local_378) {
      operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
    }
    if (local_448 != (undefined1  [8])local_438) {
      operator_delete((void *)local_448,local_438[0]._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_2b8._0_8_ != TVar4) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    if (!bVar9) {
      local_2b8._16_8_ = 0x636e657265666552;
      local_2a0 = 0x65;
      local_2b8._8_8_ = 9;
      local_448 = (undefined1  [8])local_438;
      local_388._0_4_ = CHANNELORDER_LAST;
      local_388._4_4_ = SNORM_INT8;
      local_2b8._0_8_ = TVar4;
      local_448 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_448,(ulong)local_388);
      local_438[0]._M_allocated_capacity = local_388;
      *(undefined8 *)local_448 = 0x6572206c61656449;
      builtin_strncpy((char *)((long)local_448 + 8),"ference ",8);
      builtin_strncpy((char *)((long)local_448 + 0xd),"ce image",8);
      TStack_440.order = local_388._0_4_;
      TStack_440.type = local_388._4_4_;
      *(char *)((long)local_448 + (long)local_388) = '\0';
      psVar13 = &local_400;
      tcu::LogImage::LogImage
                ((LogImage *)local_1f8,(string *)local_2b8,(string *)local_448,(Surface *)psVar13,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1f8,local_488.order,__buf_00,(size_t)psVar13);
      local_4a8._M_allocated_capacity._0_4_ = 0x6f727245;
      local_4a8._M_allocated_capacity._4_4_ = 0x73614d72;
      local_4a8._8_2_ = 0x6b;
      TStack_4b0.order = ARGB;
      TStack_4b0.type = SNORM_INT8;
      local_468._M_allocated_capacity._0_6_ = 0x20726f727245;
      local_468._M_allocated_capacity._6_2_ = 0x616d;
      local_468._M_local_buf[8] = 's';
      local_468._M_local_buf[9] = 'k';
      local_470.order = BGR;
      local_470.type = SNORM_INT8;
      local_468._10_4_ = local_468._10_4_ & 0xffffff00;
      psVar13 = &local_3b8;
      local_4b8 = (undefined1  [8])&local_4a8;
      local_478 = (undefined1  [8])&local_468;
      tcu::LogImage::LogImage
                ((LogImage *)local_388,(string *)local_4b8,(string *)local_478,(Surface *)psVar13,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_388,local_488.order,__buf_01,(size_t)psVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_p != local_358) {
        operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
      }
      if (local_388 != (undefined1  [8])&local_378) {
        operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,
                        CONCAT26(local_468._M_allocated_capacity._6_2_,
                                 local_468._M_allocated_capacity._0_6_) + 1);
      }
      if (local_4b8 != (undefined1  [8])&local_4a8) {
        operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_allocated_capacity != local_1c8) {
        operator_delete((void *)local_1d8._M_allocated_capacity,
                        (ulong)(local_1c8[0]._M_allocated_capacity + 1));
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
      }
      if (local_448 != (undefined1  [8])local_438) {
        operator_delete((void *)local_448,local_438[0]._M_allocated_capacity + 1);
      }
      if ((TextureFormat)local_2b8._0_8_ != TVar4) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
    }
    tcu::TestLog::endImageSet((TestLog *)local_488);
    tcu::Surface::~Surface((Surface *)&local_3b8);
    tcu::Surface::~Surface((Surface *)&local_400);
    goto LAB_016238ad;
  }
  iVar12 = 0;
  if (0 < gatherArgs->componentNdx) {
    iVar12 = gatherArgs->componentNdx;
  }
  local_398._0_4_ = iVar12;
  uVar35 = *(uint *)(this + 0x84);
  uVar10 = (ulong)uVar35;
  if (uVar10 < 0x22) {
    if ((0x58UL >> (uVar10 & 0x3f) & 1) == 0) {
      if ((0x2c0000000U >> (uVar10 & 0x3f) & 1) == 0) goto LAB_016233f3;
      goto LAB_0162222b;
    }
    local_288._0_4_ = DS|I;
    local_288._4_4_ = UNSIGNED_INT_11F_11F_10F_REV;
    local_288._8_4_ = 0x16;
    local_288._12_4_ = 0x10;
    local_288._16_4_ = 0x10;
    local_288._20_4_ = 0x10;
    local_270.order = R;
    local_270.type = SNORM_INT8;
    aiStack_268 = (int  [2])0x0;
    local_260.m_data[0] = true;
    local_260.m_data[1] = true;
    local_260.m_data[2] = true;
    local_260.m_data[3] = true;
    tcu::computeFixedPointThreshold((tcu *)local_1f8,local_78);
    pPVar7 = local_248.
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
             .m_data.ptr;
    local_270.order = local_1f8._0_4_;
    local_270.type = local_1f8._4_4_;
    aiStack_268[0] = IStack_1f0.m_data[0];
    aiStack_268[1] = IStack_1f0.m_data[1];
    local_288._4_4_ = CVar22;
    local_288._0_4_ = CVar22;
    local_288._12_4_ = iVar18;
    local_288._8_4_ = iVar23;
    local_288._20_4_ = iVar25;
    local_288._16_4_ = iVar18;
    local_260.m_data[0] = true;
    local_260.m_data[1] = true;
    local_260.m_data[2] = true;
    local_260.m_data[3] = true;
    CVar22 = (local_450->m_size).m_data[0];
    tcu::TextureLevel::TextureLevel(&local_2e8,&local_450->m_format,CVar22,CVar22,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2b8,&local_2e8);
    tcu::Surface::Surface((Surface *)&local_418,CVar22,CVar22);
    local_388._0_4_ = RGBA;
    local_388._4_4_ = UNORM_INT8;
    if (local_408 != (void *)0x0) {
      local_408 = local_410;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1f8,(TextureFormat *)local_388,(int)local_418,
               local_418._4_4_,1,local_408);
    local_448._0_4_ = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)local_448);
    tcu::clear((PixelBufferAccess *)local_1f8,(Vec4 *)local_388);
    if ((int)CVar22 < 1) {
      bVar9 = true;
    }
    else {
      local_2f8 = (float)(int)CVar22;
      local_3c0 = *local_458 + 1;
      local_3c8 = (Vector<float,_2> *)((*local_458)[1].m_data + 1);
      local_3d0 = *local_458 + 2;
      local_3d8 = (Vector<float,_2> *)((*local_458)[2].m_data + 1);
      bVar9 = true;
      CVar24 = R;
      do {
        local_48c = ((float)(int)CVar24 + 0.5) / local_2f8;
        local_47c = 1.0 - local_48c;
        CVar20 = R;
        do {
          local_1e8._M_allocated_capacity = 0;
          local_1e8._8_4_ = 0;
          local_1e8._12_4_ = 0;
          local_1f8._0_4_ = R;
          local_1f8._4_4_ = SNORM_INT8;
          IStack_1f0.m_data[0] = 0;
          IStack_1f0.m_data[1] = 0;
          local_388._4_4_ = CVar24;
          local_388._0_4_ = CVar20;
          (**pPVar7->_vptr_PixelOffsets)(pPVar7,(tcu *)local_388,(IVec2 (*) [4])local_1f8);
          fVar17 = ((float)(int)CVar20 + 0.5) / local_2f8;
          if (1.0 <= local_48c + fVar17) {
            uVar21 = *(undefined8 *)(*local_458)[1].m_data;
            uVar3 = *(undefined8 *)(*local_458)[3].m_data;
            fVar26 = (float)((ulong)uVar3 >> 0x20);
            fVar19 = (1.0 - fVar17) * ((float)uVar21 - (float)uVar3) + (float)uVar3;
            fVar26 = (1.0 - fVar17) * ((float)((ulong)uVar21 >> 0x20) - fVar26) + fVar26;
            pVVar11 = local_3d0;
            pVVar16 = local_3d8;
            fVar17 = local_47c;
          }
          else {
            uVar3 = *(undefined8 *)(*local_458)[0].m_data;
            uVar21 = *(undefined8 *)(*local_458)[2].m_data;
            fVar26 = (float)((ulong)uVar3 >> 0x20);
            fVar19 = fVar17 * ((float)uVar21 - (float)uVar3) + (float)uVar3;
            fVar26 = fVar17 * ((float)((ulong)uVar21 >> 0x20) - fVar26) + fVar26;
            pVVar11 = local_3c0;
            pVVar16 = local_3c8;
            fVar17 = local_48c;
          }
          local_478 = (undefined1  [8])
                      CONCAT44(fVar17 * (pVVar16->m_data[0] - (float)((ulong)uVar3 >> 0x20)) +
                               fVar26,fVar17 * (pVVar11->m_data[0] - (float)uVar3) + fVar19);
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)local_448,(int)local_450,CVar20,CVar24);
          tcu::gatherArray2DOffsets
                    ((tcu *)local_388,local_3e0->m_levels,&local_238,(float)local_478._0_4_,
                     (float)local_478._4_4_,0,local_398._0_4_,(IVec2 (*) [4])local_1f8);
          local_4b8 = local_388;
          TStack_4b0 = TStack_380;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_2b8,(Vec4 *)local_4b8,CVar20,CVar24,0);
          auVar30._4_4_ =
               -(uint)((float)local_270.type <
                      (float)(~-(uint)((float)local_4b8._4_4_ < (float)local_448._4_4_) &
                              (uint)((float)local_4b8._4_4_ - (float)local_448._4_4_) |
                             (uint)((float)local_448._4_4_ - (float)local_4b8._4_4_) &
                             -(uint)((float)local_4b8._4_4_ < (float)local_448._4_4_)));
          auVar30._0_4_ =
               -(uint)((float)local_270.order <
                      (float)(~-(uint)((float)local_4b8._0_4_ < (float)local_448._0_4_) &
                              (uint)((float)local_4b8._0_4_ - (float)local_448._0_4_) |
                             (uint)((float)local_448._0_4_ - (float)local_4b8._0_4_) &
                             -(uint)((float)local_4b8._0_4_ < (float)local_448._0_4_)));
          auVar30._8_4_ =
               -(uint)((float)aiStack_268[0] <
                      (float)(~-(uint)((float)TStack_4b0.order < (float)TStack_440.order) &
                              (uint)((float)TStack_4b0.order - (float)TStack_440.order) |
                             (uint)((float)TStack_440.order - (float)TStack_4b0.order) &
                             -(uint)((float)TStack_4b0.order < (float)TStack_440.order)));
          auVar30._12_4_ =
               -(uint)((float)aiStack_268[1] <
                      (float)(~-(uint)((float)TStack_4b0.type < (float)TStack_440.type) &
                              (uint)((float)TStack_4b0.type - (float)TStack_440.type) |
                             (uint)((float)TStack_440.type - (float)TStack_4b0.type) &
                             -(uint)((float)TStack_4b0.type < (float)TStack_440.type)));
          auVar29 = packssdw(auVar30,auVar30);
          auVar29 = packsswb(auVar29,auVar29);
          auVar29 = ZEXT416((uint)local_260.m_data) & auVar29 & _DAT_01b805f0;
          uVar35 = auVar29._0_4_;
          if (((auVar29[0] != '\0') || ((uVar35 >> 8 & 1) != 0)) ||
             (((uVar35 >> 0x10 & 1) != 0 || ((uVar35 >> 0x18 & 1) != 0)))) {
            bVar8 = tcu::isGatherOffsetsResultValid
                              (local_3e0,&local_238,(LookupPrecision *)local_288,(Vec2 *)local_478,
                               local_398._0_4_,(IVec2 (*) [4])local_1f8,(Vec4 *)local_448);
            if (!bVar8) {
              *(undefined4 *)((long)local_410 + (long)(int)((int)local_418 * CVar24 + CVar20) * 4) =
                   0xff0000ff;
              bVar9 = false;
            }
          }
          CVar20 = CVar20 + A;
        } while (CVar22 != CVar20);
        CVar24 = CVar24 + A;
      } while (CVar24 != CVar22);
    }
    local_438[0]._0_4_ = 0x69726556;
    local_438[0]._4_4_ = 0x65527966;
    local_438[0]._8_4_ = 0x746c7573;
    TStack_440.order = sR;
    TStack_440.type = SNORM_INT8;
    local_438[0]._M_local_buf[0xc] = '\0';
    local_4b8 = (undefined1  [8])&local_4a8;
    local_1f8._0_4_ = S;
    local_1f8._4_4_ = SNORM_INT8;
    local_448 = (undefined1  [8])local_438;
    local_4b8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_4b8,(ulong)local_1f8);
    local_4a8._M_allocated_capacity = (size_type)local_1f8;
    *(undefined8 *)local_4b8 = 0x6163696669726556;
    builtin_strncpy((char *)((long)local_4b8 + 8),"tion res",8);
    builtin_strncpy((char *)((long)local_4b8 + 0xf),"sult",4);
    TStack_4b0.order = local_1f8._0_4_;
    TStack_4b0.type = local_1f8._4_4_;
    *(char *)((long)local_4b8 + (long)local_1f8) = '\0';
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_388,(string *)local_448,(string *)local_4b8);
    TVar4 = local_488;
    tcu::TestLog::startImageSet((TestLog *)local_488,(char *)local_388,local_368._M_p);
    local_468._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_468._M_allocated_capacity._6_2_ = 0x6465;
    local_470.order = RGBA;
    local_470.type = SNORM_INT8;
    local_468._M_local_buf[8] = '\0';
    paVar2 = &local_400.field_2;
    local_400.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
    local_400.field_2._M_allocated_capacity._6_2_ = 0x6465;
    local_400.field_2._8_2_ = 0x6920;
    local_400.field_2._10_4_ = 0x6567616d;
    local_400._M_string_length = 0xe;
    local_400.field_2._M_local_buf[0xe] = '\0';
    pCVar14 = local_450;
    local_478 = (undefined1  [8])&local_468;
    local_400._M_dataplus._M_p = (pointer)paVar2;
    tcu::LogImage::LogImage
              ((LogImage *)local_1f8,(string *)local_478,&local_400,local_450,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1f8,TVar4.order,__buf_02,(size_t)pCVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_allocated_capacity != local_1c8) {
      operator_delete((void *)local_1d8._M_allocated_capacity,
                      (ulong)(local_1c8[0]._M_allocated_capacity + 1));
    }
    if (local_1f8 != (undefined1  [8])&local_1e8) {
      operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != paVar2) {
      operator_delete(local_400._M_dataplus._M_p,
                      CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                               local_400.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if (local_478 != (undefined1  [8])&local_468) {
      operator_delete((void *)local_478,
                      CONCAT26(local_468._M_allocated_capacity._6_2_,
                               local_468._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_p != local_358) {
      operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
    }
    if (local_388 != (undefined1  [8])&local_378) {
      operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
    }
    if (local_4b8 != (undefined1  [8])&local_4a8) {
      operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
    }
    if (local_448 != (undefined1  [8])local_438) {
      operator_delete((void *)local_448,local_438[0]._M_allocated_capacity + 1);
    }
    if (!bVar9) {
      local_4b8 = (undefined1  [8])&local_4a8;
      local_4a8._M_allocated_capacity._0_4_ = 0x65666552;
      local_4a8._M_allocated_capacity._4_4_ = 0x636e6572;
      local_4a8._8_2_ = 0x65;
      TStack_4b0.order = ARGB;
      TStack_4b0.type = SNORM_INT8;
      local_388._0_4_ = CHANNELORDER_LAST;
      local_388._4_4_ = SNORM_INT8;
      local_478 = (undefined1  [8])&local_468;
      local_478 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_478,(ulong)local_388);
      local_468._M_allocated_capacity._0_6_ = local_388._0_6_;
      local_468._M_allocated_capacity._6_2_ = local_388._6_2_;
      *(undefined8 *)local_478 = 0x6572206c61656449;
      *(char *)((long)local_478 + 8) = 'f';
      *(char *)((long)local_478 + 9) = 'e';
      *(char *)((long)local_478 + 10) = 'r';
      *(char *)((long)local_478 + 0xb) = 'e';
      *(char *)((long)local_478 + 0xc) = 'n';
      *(char *)((long)local_478 + 0xd) = 'c';
      *(char *)((long)local_478 + 0xe) = 'e';
      *(char *)((long)local_478 + 0xf) = ' ';
      *(char *)((long)local_478 + 0xd) = 'c';
      *(char *)((long)local_478 + 0xe) = 'e';
      *(char *)((long)local_478 + 0xf) = ' ';
      *(char *)((long)local_478 + 0x10) = 'i';
      *(char *)((long)local_478 + 0x11) = 'm';
      *(char *)((long)local_478 + 0x12) = 'a';
      *(char *)((long)local_478 + 0x13) = 'g';
      *(char *)((long)local_478 + 0x14) = 'e';
      local_470.order = local_388._0_4_;
      local_470.type = local_388._4_4_;
      *(char *)((long)local_478 + (long)local_388) = '\0';
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_448,&local_2e8);
      pCVar14 = (ConstPixelBufferAccess *)local_448;
      tcu::LogImage::LogImage
                ((LogImage *)local_1f8,(string *)local_4b8,(string *)local_478,pCVar14,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1f8,local_488.order,__buf_03,(size_t)pCVar14);
      local_400.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
      local_400.field_2._M_allocated_capacity._6_2_ = 0x7361;
      local_400.field_2._8_2_ = 0x6b;
      local_400._M_string_length = 9;
      local_3b8.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_3b8.field_2._8_2_ = 0x6b73;
      local_3b8._M_string_length = 10;
      local_3b8.field_2._M_local_buf[10] = '\0';
      pSVar15 = (Surface *)&local_418;
      local_400._M_dataplus._M_p = (pointer)paVar2;
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      tcu::LogImage::LogImage
                ((LogImage *)local_388,&local_400,&local_3b8,pSVar15,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_388,local_488.order,__buf_04,(size_t)pSVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_p != local_358) {
        operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
      }
      if (local_388 != (undefined1  [8])&local_378) {
        operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != paVar2) {
        operator_delete(local_400._M_dataplus._M_p,
                        CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                                 local_400.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_allocated_capacity != local_1c8) {
        operator_delete((void *)local_1d8._M_allocated_capacity,
                        (ulong)(local_1c8[0]._M_allocated_capacity + 1));
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,
                        CONCAT26(local_468._M_allocated_capacity._6_2_,
                                 local_468._M_allocated_capacity._0_6_) + 1);
      }
      if (local_4b8 != (undefined1  [8])&local_4a8) {
        operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
      }
    }
    tcu::TestLog::endImageSet((TestLog *)local_488);
  }
  else {
LAB_016233f3:
    if (2 < uVar35 - 0x1b) {
LAB_01623c94:
      bVar9 = false;
      goto LAB_016238ad;
    }
LAB_0162222b:
    local_270.order = R;
    local_270.type = SNORM_INT8;
    aiStack_268[0] = 0;
    aiStack_268[1] = 0;
    local_288._4_4_ = CVar22;
    local_288._0_4_ = CVar22;
    local_288._12_4_ = iVar18;
    local_288._8_4_ = iVar23;
    local_288._20_4_ = iVar25;
    local_288._16_4_ = iVar18;
    local_260.m_data[0] = true;
    local_260.m_data[1] = true;
    local_260.m_data[2] = true;
    local_260.m_data[3] = true;
    if ((uVar35 < 0x22) && ((0x2c0000000U >> ((ulong)uVar35 & 0x3f) & 1) != 0)) {
      fVar17 = (float)(local_450->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_2e8,&local_450->m_format,(int)fVar17,(int)fVar17,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2b8,&local_2e8);
      tcu::Surface::Surface((Surface *)&local_418,(int)fVar17,(int)fVar17);
      local_388._0_4_ = RGBA;
      local_388._4_4_ = UNORM_INT8;
      if (local_408 != (void *)0x0) {
        local_408 = local_410;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1f8,(TextureFormat *)local_388,(int)local_418,
                 local_418._4_4_,1,local_408);
      local_448._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_448);
      tcu::clear((PixelBufferAccess *)local_1f8,(Vec4 *)local_388);
      if ((int)fVar17 < 1) {
        bVar9 = true;
      }
      else {
        local_48c = (float)(int)fVar17;
        local_3c8 = *local_458 + 1;
        local_3d0 = (Vector<float,_2> *)((*local_458)[1].m_data + 1);
        local_3d8 = *local_458 + 2;
        local_250 = (Vector<float,_2> *)((*local_458)[2].m_data + 1);
        bVar9 = true;
        fVar19 = 0.0;
        do {
          local_47c = ((float)(int)fVar19 + 0.5) / local_48c;
          local_3c0 = (Vector<float,_2> *)CONCAT44(local_3c0._4_4_,1.0 - local_47c);
          fVar26 = 0.0;
          do {
            local_1e8._M_allocated_capacity = 0;
            local_1e8._8_4_ = 0;
            local_1e8._12_4_ = 0;
            local_1f8._0_4_ = R;
            local_1f8._4_4_ = SNORM_INT8;
            IStack_1f0.m_data[0] = 0;
            IStack_1f0.m_data[1] = 0;
            local_388._0_4_ = fVar26;
            local_388._4_4_ = fVar19;
            (**pPVar7->_vptr_PixelOffsets)(pPVar7,(tcu *)local_388,(IVec2 (*) [4])local_1f8);
            fVar27 = ((float)(int)fVar26 + 0.5) / local_48c;
            if (1.0 <= local_47c + fVar27) {
              uVar21 = *(undefined8 *)(*local_458)[1].m_data;
              uVar3 = *(undefined8 *)(*local_458)[3].m_data;
              fVar32 = (float)((ulong)uVar3 >> 0x20);
              fVar31 = (1.0 - fVar27) * ((float)uVar21 - (float)uVar3) + (float)uVar3;
              fVar32 = (1.0 - fVar27) * ((float)((ulong)uVar21 >> 0x20) - fVar32) + fVar32;
              pVVar11 = local_3d8;
              pVVar16 = local_250;
              fVar27 = local_3c0._0_4_;
            }
            else {
              uVar3 = *(undefined8 *)(*local_458)[0].m_data;
              uVar21 = *(undefined8 *)(*local_458)[2].m_data;
              fVar32 = (float)((ulong)uVar3 >> 0x20);
              fVar31 = fVar27 * ((float)uVar21 - (float)uVar3) + (float)uVar3;
              fVar32 = fVar27 * ((float)((ulong)uVar21 >> 0x20) - fVar32) + fVar32;
              pVVar11 = local_3c8;
              pVVar16 = local_3d0;
              fVar27 = local_47c;
            }
            local_4b8._0_4_ = fVar27 * (pVVar11->m_data[0] - (float)uVar3) + fVar31;
            local_4b8._4_4_ = fVar27 * (pVVar16->m_data[0] - (float)((ulong)uVar3 >> 0x20)) + fVar32
            ;
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)local_448,(int)local_450,(int)fVar26,(int)fVar19);
            tcu::gatherArray2DOffsets
                      ((tcu *)local_388,local_3e0->m_levels,&local_238,(float)local_4b8._0_4_,
                       (float)local_4b8._4_4_,0,local_398._0_4_,(IVec2 (*) [4])local_1f8);
            local_2f8 = (float)((int)((float)local_388._0_4_ - 2.1474836e+09) &
                                (int)(float)local_388._0_4_ >> 0x1f | (int)(float)local_388._0_4_);
            CStack_2f4 = (int)((float)local_388._4_4_ - 2.1474836e+09) &
                         (int)(float)local_388._4_4_ >> 0x1f | (int)(float)local_388._4_4_;
            CStack_2f0 = (int)((float)TStack_380.order - 2.1474836e+09) &
                         (int)(float)TStack_380.order >> 0x1f | (int)(float)TStack_380.order;
            CStack_2ec = (int)((float)TStack_380.type - 2.1474836e+09) &
                         (int)(float)TStack_380.type >> 0x1f | (int)(float)TStack_380.type;
            local_388._4_4_ = CStack_2f4;
            local_388._0_4_ = local_2f8;
            TStack_380.type = CStack_2ec;
            TStack_380.order = CStack_2f0;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_2b8,(IVec4 *)local_388,(int)fVar26,(int)fVar19,0);
            uVar35 = -(uint)((int)(CStack_2f4 ^ 0x80000000) < (int)-(float)local_448._4_4_);
            uVar36 = -(uint)((int)(CStack_2f0 ^ 0x80000000) < (int)-(float)TStack_440.order);
            uVar37 = -(uint)((int)(CStack_2ec ^ 0x80000000) < (int)-(float)TStack_440.type);
            auVar33._0_4_ =
                 -(uint)((int)-(float)local_270.order <
                        (int)(-(uint)((int)-local_2f8 < (int)-(float)local_448._0_4_) -
                              (local_448._0_4_ - (int)local_2f8 ^
                              -(uint)((int)-local_2f8 < (int)-(float)local_448._0_4_)) ^ 0x80000000)
                        );
            auVar33._4_4_ =
                 -(uint)((int)-(float)local_270.type <
                        (int)(uVar35 - (local_448._4_4_ - CStack_2f4 ^ uVar35) ^ 0x80000000));
            auVar33._8_4_ =
                 -(uint)((int)-(float)aiStack_268[0] <
                        (int)(uVar36 - (TStack_440.order - CStack_2f0 ^ uVar36) ^ 0x80000000));
            auVar33._12_4_ =
                 -(uint)((int)-(float)aiStack_268[1] <
                        (int)(uVar37 - (TStack_440.type - CStack_2ec ^ uVar37) ^ 0x80000000));
            auVar29 = packssdw(auVar33,auVar33);
            auVar29 = packsswb(auVar29,auVar29);
            auVar29 = ZEXT416((uint)local_260.m_data) & auVar29 & _DAT_01b805f0;
            uVar35 = auVar29._0_4_;
            if (((auVar29[0] != '\0') || ((uVar35 >> 8 & 1) != 0)) ||
               (((uVar35 >> 0x10 & 1) != 0 || ((uVar35 >> 0x18 & 1) != 0)))) {
              bVar8 = tcu::isGatherOffsetsResultValid
                                (local_3e0,&local_238,(IntLookupPrecision *)local_288,
                                 (Vec2 *)local_4b8,local_398._0_4_,(IVec2 (*) [4])local_1f8,
                                 (UVec4 *)local_448);
              if (!bVar8) {
                *(undefined4 *)
                 ((long)local_410 + (long)((int)local_418 * (int)fVar19 + (int)fVar26) * 4) =
                     0xff0000ff;
                bVar9 = false;
              }
            }
            fVar26 = (float)((int)fVar26 + 1);
          } while (fVar17 != fVar26);
          fVar19 = (float)((int)fVar19 + 1);
        } while (fVar19 != fVar17);
      }
      local_438[0]._0_4_ = 0x69726556;
      local_438[0]._4_4_ = 0x65527966;
      local_438[0]._8_4_ = 0x746c7573;
      TStack_440.order = sR;
      TStack_440.type = SNORM_INT8;
      local_438[0]._M_local_buf[0xc] = '\0';
      local_4b8 = (undefined1  [8])&local_4a8;
      local_1f8._0_4_ = S;
      local_1f8._4_4_ = SNORM_INT8;
      local_448 = (undefined1  [8])local_438;
      local_4b8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_4b8,(ulong)local_1f8);
      local_4a8._M_allocated_capacity = (size_type)local_1f8;
      *(undefined8 *)local_4b8 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_4b8 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_4b8 + 0xf),"sult",4);
      TStack_4b0.order = local_1f8._0_4_;
      TStack_4b0.type = local_1f8._4_4_;
      *(char *)((long)local_4b8 + (long)local_1f8) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_388,(string *)local_448,(string *)local_4b8);
      TVar4 = local_488;
      tcu::TestLog::startImageSet((TestLog *)local_488,(char *)local_388,local_368._M_p);
      local_468._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_468._M_allocated_capacity._6_2_ = 0x6465;
      local_470.order = RGBA;
      local_470.type = SNORM_INT8;
      local_468._M_local_buf[8] = '\0';
      paVar2 = &local_400.field_2;
      local_400.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_400.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_400.field_2._8_2_ = 0x6920;
      local_400.field_2._10_4_ = 0x6567616d;
      local_400._M_string_length = 0xe;
      local_400.field_2._M_local_buf[0xe] = '\0';
      pCVar14 = local_450;
      local_478 = (undefined1  [8])&local_468;
      local_400._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                ((LogImage *)local_1f8,(string *)local_478,&local_400,local_450,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1f8,TVar4.order,__buf_05,(size_t)pCVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_allocated_capacity != local_1c8) {
        operator_delete((void *)local_1d8._M_allocated_capacity,
                        (ulong)(local_1c8[0]._M_allocated_capacity + 1));
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != paVar2) {
        operator_delete(local_400._M_dataplus._M_p,
                        CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                                 local_400.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,
                        CONCAT26(local_468._M_allocated_capacity._6_2_,
                                 local_468._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_p != local_358) {
        operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
      }
      if (local_388 != (undefined1  [8])&local_378) {
        operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
      }
      if (local_4b8 != (undefined1  [8])&local_4a8) {
        operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
      }
      if (local_448 != (undefined1  [8])local_438) {
        operator_delete((void *)local_448,local_438[0]._M_allocated_capacity + 1);
      }
      if (!bVar9) {
        local_4b8 = (undefined1  [8])&local_4a8;
        local_4a8._M_allocated_capacity._0_4_ = 0x65666552;
        local_4a8._M_allocated_capacity._4_4_ = 0x636e6572;
        local_4a8._8_2_ = 0x65;
        TStack_4b0.order = ARGB;
        TStack_4b0.type = SNORM_INT8;
        local_388._0_4_ = CHANNELORDER_LAST;
        local_388._4_4_ = SNORM_INT8;
        local_478 = (undefined1  [8])&local_468;
        local_478 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_478,(ulong)local_388);
        local_468._M_allocated_capacity._0_6_ = local_388._0_6_;
        local_468._M_allocated_capacity._6_2_ = local_388._6_2_;
        *(undefined8 *)local_478 = 0x6572206c61656449;
        *(char *)((long)local_478 + 8) = 'f';
        *(char *)((long)local_478 + 9) = 'e';
        *(char *)((long)local_478 + 10) = 'r';
        *(char *)((long)local_478 + 0xb) = 'e';
        *(char *)((long)local_478 + 0xc) = 'n';
        *(char *)((long)local_478 + 0xd) = 'c';
        *(char *)((long)local_478 + 0xe) = 'e';
        *(char *)((long)local_478 + 0xf) = ' ';
        *(char *)((long)local_478 + 0xd) = 'c';
        *(char *)((long)local_478 + 0xe) = 'e';
        *(char *)((long)local_478 + 0xf) = ' ';
        *(char *)((long)local_478 + 0x10) = 'i';
        *(char *)((long)local_478 + 0x11) = 'm';
        *(char *)((long)local_478 + 0x12) = 'a';
        *(char *)((long)local_478 + 0x13) = 'g';
        *(char *)((long)local_478 + 0x14) = 'e';
        local_470.order = local_388._0_4_;
        local_470.type = local_388._4_4_;
        *(char *)((long)local_478 + (long)local_388) = '\0';
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_448,&local_2e8);
        pCVar14 = (ConstPixelBufferAccess *)local_448;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1f8,(string *)local_4b8,(string *)local_478,pCVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1f8,local_488.order,__buf_06,(size_t)pCVar14);
        local_400.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_400.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_400.field_2._8_2_ = 0x6b;
        local_400._M_string_length = 9;
        local_3b8.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_3b8.field_2._8_2_ = 0x6b73;
        local_3b8._M_string_length = 10;
        local_3b8.field_2._M_local_buf[10] = '\0';
        pSVar15 = (Surface *)&local_418;
        local_400._M_dataplus._M_p = (pointer)paVar2;
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        tcu::LogImage::LogImage
                  ((LogImage *)local_388,&local_400,&local_3b8,pSVar15,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_388,local_488.order,__buf_07,(size_t)pSVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_p != local_358) {
          operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
        }
        if (local_388 != (undefined1  [8])&local_378) {
          operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != paVar2) {
          operator_delete(local_400._M_dataplus._M_p,
                          CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                                   local_400.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_allocated_capacity != local_1c8) {
          operator_delete((void *)local_1d8._M_allocated_capacity,
                          (ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        if (local_1f8 != (undefined1  [8])&local_1e8) {
          operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
        }
        if (local_478 != (undefined1  [8])&local_468) {
          operator_delete((void *)local_478,
                          CONCAT26(local_468._M_allocated_capacity._6_2_,
                                   local_468._M_allocated_capacity._0_6_) + 1);
        }
        if (local_4b8 != (undefined1  [8])&local_4a8) {
          operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet((TestLog *)local_488);
    }
    else {
      if (2 < uVar35 - 0x1b) goto LAB_01623c94;
      CVar22 = (local_450->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel(&local_2e8,&local_450->m_format,CVar22,CVar22,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2b8,&local_2e8);
      tcu::Surface::Surface((Surface *)&local_418,CVar22,CVar22);
      local_388._0_4_ = RGBA;
      local_388._4_4_ = UNORM_INT8;
      if (local_408 != (void *)0x0) {
        local_408 = local_410;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1f8,(TextureFormat *)local_388,(int)local_418,
                 local_418._4_4_,1,local_408);
      local_448._0_4_ = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)local_448);
      tcu::clear((PixelBufferAccess *)local_1f8,(Vec4 *)local_388);
      if ((int)CVar22 < 1) {
        bVar9 = true;
      }
      else {
        local_2f8 = (float)(int)CVar22;
        local_3c0 = *local_458 + 1;
        local_3c8 = (Vector<float,_2> *)((*local_458)[1].m_data + 1);
        local_3d0 = *local_458 + 2;
        local_3d8 = (Vector<float,_2> *)((*local_458)[2].m_data + 1);
        bVar9 = true;
        CVar24 = R;
        do {
          local_48c = ((float)(int)CVar24 + 0.5) / local_2f8;
          local_47c = 1.0 - local_48c;
          CVar20 = R;
          do {
            local_1e8._M_allocated_capacity = 0;
            local_1e8._8_4_ = 0;
            local_1e8._12_4_ = 0;
            local_1f8._0_4_ = R;
            local_1f8._4_4_ = SNORM_INT8;
            IStack_1f0.m_data[0] = 0;
            IStack_1f0.m_data[1] = 0;
            local_388._4_4_ = CVar24;
            local_388._0_4_ = CVar20;
            (**pPVar7->_vptr_PixelOffsets)(pPVar7,(tcu *)local_388,(IVec2 (*) [4])local_1f8);
            fVar17 = ((float)(int)CVar20 + 0.5) / local_2f8;
            if (1.0 <= local_48c + fVar17) {
              uVar21 = *(undefined8 *)(*local_458)[1].m_data;
              uVar3 = *(undefined8 *)(*local_458)[3].m_data;
              fVar26 = (float)((ulong)uVar3 >> 0x20);
              fVar19 = (1.0 - fVar17) * ((float)uVar21 - (float)uVar3) + (float)uVar3;
              fVar26 = (1.0 - fVar17) * ((float)((ulong)uVar21 >> 0x20) - fVar26) + fVar26;
              pVVar11 = local_3d0;
              pVVar16 = local_3d8;
              fVar17 = local_47c;
            }
            else {
              uVar3 = *(undefined8 *)(*local_458)[0].m_data;
              uVar21 = *(undefined8 *)(*local_458)[2].m_data;
              fVar26 = (float)((ulong)uVar3 >> 0x20);
              fVar19 = fVar17 * ((float)uVar21 - (float)uVar3) + (float)uVar3;
              fVar26 = fVar17 * ((float)((ulong)uVar21 >> 0x20) - fVar26) + fVar26;
              pVVar11 = local_3c0;
              pVVar16 = local_3c8;
              fVar17 = local_48c;
            }
            local_478 = (undefined1  [8])
                        CONCAT44(fVar17 * (pVVar16->m_data[0] - (float)((ulong)uVar3 >> 0x20)) +
                                 fVar26,fVar17 * (pVVar11->m_data[0] - (float)uVar3) + fVar19);
            tcu::ConstPixelBufferAccess::getPixelT<int>
                      ((ConstPixelBufferAccess *)local_448,(int)local_450,CVar20,CVar24);
            tcu::gatherArray2DOffsets
                      ((tcu *)local_388,local_3e0->m_levels,&local_238,(float)local_478._0_4_,
                       (float)local_478._4_4_,0,local_398._0_4_,(IVec2 (*) [4])local_1f8);
            local_4b8._4_4_ = (int)(float)local_388._4_4_;
            local_4b8._0_4_ = (int)(float)local_388._0_4_;
            TStack_4b0.type = (int)(float)TStack_380.type;
            TStack_4b0.order = (int)(float)TStack_380.order;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_2b8,(IVec4 *)local_4b8,CVar20,CVar24,0);
            auVar34._0_4_ =
                 -(uint)((int)local_270.order <
                        (int)(-(uint)((int)local_4b8._0_4_ < (int)local_448._0_4_) -
                             (local_448._0_4_ - local_4b8._0_4_ ^
                             -(uint)((int)local_4b8._0_4_ < (int)local_448._0_4_))));
            auVar34._4_4_ =
                 -(uint)((int)local_270.type <
                        (int)(-(uint)((int)local_4b8._4_4_ < (int)local_448._4_4_) -
                             (local_448._4_4_ - local_4b8._4_4_ ^
                             -(uint)((int)local_4b8._4_4_ < (int)local_448._4_4_))));
            auVar34._8_4_ =
                 -(uint)(aiStack_268[0] <
                        (int)(-(uint)((int)TStack_4b0.order < (int)TStack_440.order) -
                             (TStack_440.order - TStack_4b0.order ^
                             -(uint)((int)TStack_4b0.order < (int)TStack_440.order))));
            auVar34._12_4_ =
                 -(uint)(aiStack_268[1] <
                        (int)(-(uint)((int)TStack_4b0.type < (int)TStack_440.type) -
                             (TStack_440.type - TStack_4b0.type ^
                             -(uint)((int)TStack_4b0.type < (int)TStack_440.type))));
            auVar29 = packssdw(auVar34,auVar34);
            auVar29 = packsswb(auVar29,auVar29);
            auVar29 = ZEXT416((uint)local_260.m_data) & auVar29 & _DAT_01b805f0;
            uVar35 = auVar29._0_4_;
            if ((((auVar29[0] != '\0') || ((uVar35 >> 8 & 1) != 0)) || ((uVar35 >> 0x10 & 1) != 0))
               || ((uVar35 >> 0x18 & 1) != 0)) {
              bVar8 = tcu::isGatherOffsetsResultValid
                                (local_3e0,&local_238,(IntLookupPrecision *)local_288,
                                 (Vec2 *)local_478,local_398._0_4_,(IVec2 (*) [4])local_1f8,
                                 (IVec4 *)local_448);
              if (!bVar8) {
                *(undefined4 *)((long)local_410 + (long)(int)((int)local_418 * CVar24 + CVar20) * 4)
                     = 0xff0000ff;
                bVar9 = false;
              }
            }
            CVar20 = CVar20 + A;
          } while (CVar22 != CVar20);
          CVar24 = CVar24 + A;
        } while (CVar24 != CVar22);
      }
      local_438[0]._0_4_ = 0x69726556;
      local_438[0]._4_4_ = 0x65527966;
      local_438[0]._8_4_ = 0x746c7573;
      TStack_440.order = sR;
      TStack_440.type = SNORM_INT8;
      local_438[0]._M_local_buf[0xc] = '\0';
      local_4b8 = (undefined1  [8])&local_4a8;
      local_1f8._0_4_ = S;
      local_1f8._4_4_ = SNORM_INT8;
      local_448 = (undefined1  [8])local_438;
      local_4b8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_4b8,(ulong)local_1f8);
      local_4a8._M_allocated_capacity = (size_type)local_1f8;
      *(undefined8 *)local_4b8 = 0x6163696669726556;
      builtin_strncpy((char *)((long)local_4b8 + 8),"tion res",8);
      builtin_strncpy((char *)((long)local_4b8 + 0xf),"sult",4);
      TStack_4b0.order = local_1f8._0_4_;
      TStack_4b0.type = local_1f8._4_4_;
      *(char *)((long)local_4b8 + (long)local_1f8) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_388,(string *)local_448,(string *)local_4b8);
      TVar4 = local_488;
      tcu::TestLog::startImageSet((TestLog *)local_488,(char *)local_388,local_368._M_p);
      local_468._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_468._M_allocated_capacity._6_2_ = 0x6465;
      local_470.order = RGBA;
      local_470.type = SNORM_INT8;
      local_468._M_local_buf[8] = '\0';
      paVar2 = &local_400.field_2;
      local_400.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
      local_400.field_2._M_allocated_capacity._6_2_ = 0x6465;
      local_400.field_2._8_2_ = 0x6920;
      local_400.field_2._10_4_ = 0x6567616d;
      local_400._M_string_length = 0xe;
      local_400.field_2._M_local_buf[0xe] = '\0';
      pCVar14 = local_450;
      local_478 = (undefined1  [8])&local_468;
      local_400._M_dataplus._M_p = (pointer)paVar2;
      tcu::LogImage::LogImage
                ((LogImage *)local_1f8,(string *)local_478,&local_400,local_450,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1f8,TVar4.order,__buf_08,(size_t)pCVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_allocated_capacity != local_1c8) {
        operator_delete((void *)local_1d8._M_allocated_capacity,
                        (ulong)(local_1c8[0]._M_allocated_capacity + 1));
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != paVar2) {
        operator_delete(local_400._M_dataplus._M_p,
                        CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                                 local_400.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,
                        CONCAT26(local_468._M_allocated_capacity._6_2_,
                                 local_468._M_allocated_capacity._0_6_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_p != local_358) {
        operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
      }
      if (local_388 != (undefined1  [8])&local_378) {
        operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
      }
      if (local_4b8 != (undefined1  [8])&local_4a8) {
        operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
      }
      if (local_448 != (undefined1  [8])local_438) {
        operator_delete((void *)local_448,local_438[0]._M_allocated_capacity + 1);
      }
      if (!bVar9) {
        local_4b8 = (undefined1  [8])&local_4a8;
        local_4a8._M_allocated_capacity._0_4_ = 0x65666552;
        local_4a8._M_allocated_capacity._4_4_ = 0x636e6572;
        local_4a8._8_2_ = 0x65;
        TStack_4b0.order = ARGB;
        TStack_4b0.type = SNORM_INT8;
        local_478 = (undefined1  [8])&local_468;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_478,"Ideal reference image","");
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_448,&local_2e8);
        pCVar14 = (ConstPixelBufferAccess *)local_448;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1f8,(string *)local_4b8,(string *)local_478,pCVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1f8,local_488.order,__buf_09,(size_t)pCVar14);
        local_400.field_2._M_allocated_capacity._0_6_ = 0x4d726f727245;
        local_400.field_2._M_allocated_capacity._6_2_ = 0x7361;
        local_400.field_2._8_2_ = 0x6b;
        local_400._M_string_length = 9;
        local_3b8.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_3b8.field_2._8_2_ = 0x6b73;
        local_3b8._M_string_length = 10;
        local_3b8.field_2._M_local_buf[10] = '\0';
        pSVar15 = (Surface *)&local_418;
        local_400._M_dataplus._M_p = (pointer)paVar2;
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        tcu::LogImage::LogImage
                  ((LogImage *)local_388,&local_400,&local_3b8,pSVar15,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_388,local_488.order,__buf_10,(size_t)pSVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_p != local_358) {
          operator_delete(local_368._M_p,local_358[0]._M_allocated_capacity + 1);
        }
        if (local_388 != (undefined1  [8])&local_378) {
          operator_delete((void *)local_388,local_378._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != paVar2) {
          operator_delete(local_400._M_dataplus._M_p,
                          CONCAT26(local_400.field_2._M_allocated_capacity._6_2_,
                                   local_400.field_2._M_allocated_capacity._0_6_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_allocated_capacity != local_1c8) {
          operator_delete((void *)local_1d8._M_allocated_capacity,
                          (ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        if (local_1f8 != (undefined1  [8])&local_1e8) {
          operator_delete((void *)local_1f8,(ulong)(local_1e8._M_allocated_capacity + 1));
        }
        if (local_478 != (undefined1  [8])&local_468) {
          operator_delete((void *)local_478,
                          CONCAT26(local_468._M_allocated_capacity._6_2_,
                                   local_468._M_allocated_capacity._0_6_) + 1);
        }
        if (local_4b8 != (undefined1  [8])&local_4a8) {
          operator_delete((void *)local_4b8,local_4a8._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet((TestLog *)local_488);
    }
  }
  tcu::Surface::~Surface((Surface *)&local_418);
  tcu::TextureLevel::~TextureLevel(&local_2e8);
LAB_016238ad:
  if (local_248.
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_248.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
  return bVar9;
}

Assistant:

bool TextureGatherCase::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_testCtx.getLog();

	if (m_flags & GATHERCASE_MIPMAP_INCOMPLETE)
	{
		const int	componentNdx		= de::max(0, gatherArgs.componentNdx);
		const Vec4	incompleteColor		(0.0f, 0.0f, 0.0f, 1.0f);
		const Vec4	refColor			(incompleteColor[componentNdx]);
		const bool	isOk				= verifySingleColored(log, rendered, refColor);

		if (!isOk)
			log << TestLog::Message << "Note: expected color " << refColor << " for all pixels; "
									<< incompleteColor[componentNdx] << " is component at index " << componentNdx
									<< " in the color " << incompleteColor << ", which is used for incomplete textures" << TestLog::EndMessage;

		return isOk;
	}
	else
	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_gatherType, gatherArgs, getOffsetRange());
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_wrapS;
		sampler.wrapT		= m_wrapT;
		sampler.compare		= m_shadowCompareMode;

		if (isDepthFormat(m_textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_textureFormat.type) || isSIntFormatType(m_textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}